

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

int SetApproximateSampleRate(snd_pcm_t *pcm,snd_pcm_hw_params_t *hwParams,double sampleRate)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  long errorCode;
  char *pcVar4;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int _dir;
  uint _max;
  uint _min;
  int __pa_unsure_error_id;
  uint deviation;
  uint setRate;
  uint reqRate;
  PaError result;
  double sampleRate_local;
  snd_pcm_hw_params_t *hwParams_local;
  snd_pcm_t *pcm_local;
  
  setRate = 0;
  _reqRate = sampleRate;
  sampleRate_local = (double)hwParams;
  hwParams_local = (snd_pcm_hw_params_t *)pcm;
  if ((pcm != (snd_pcm_t *)0x0) && (hwParams != (snd_pcm_hw_params_t *)0x0)) {
    __pa_unsure_error_id = (int)(long)sampleRate;
    deviation = __pa_unsure_error_id;
    _max = (*(code *)alsa_snd_pcm_hw_params_set_rate_near)(pcm,hwParams,&__pa_unsure_error_id,0);
    if ((int)_max < 0) {
      pVar3 = pthread_self();
      iVar1 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar1 != 0) {
        errorCode = (long)(int)_max;
        pcVar4 = (*alsa_snd_strerror)(_max);
        PaUtil_SetLastHostErrorInfo(paALSA,errorCode,pcVar4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &setRate, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3196\n"
                       );
      while( true ) {
        while( true ) {
          setRate = 0xffffd8f1;
          _dir = 0;
          __pa_unsure_error_id_1 = 0;
          __pa_unsure_error_id_2 = 0;
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_get_rate_min)
                            (sampleRate_local,&_dir,&__pa_unsure_error_id_2);
          if (-1 < iVar1) break;
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            pcVar4 = (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_get_rate_min( hwParams, &_min, &_dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3211\n"
                           );
        }
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_get_rate_max)
                          (sampleRate_local,&__pa_unsure_error_id_1,&__pa_unsure_error_id_2);
        if (-1 < iVar1) break;
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar4 = (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_get_rate_max( hwParams, &_max, &_dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3212\n"
                         );
      }
    }
    else {
      iVar1 = __pa_unsure_error_id - deviation;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if ((iVar1 != 0) && (deviation < (uint)(iVar1 * 100))) {
        setRate = 0xffffd8f3;
      }
    }
    return setRate;
  }
  __assert_fail("pcm && hwParams",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xc77,"int SetApproximateSampleRate(snd_pcm_t *, snd_pcm_hw_params_t *, double)");
}

Assistant:

static int SetApproximateSampleRate( snd_pcm_t *pcm, snd_pcm_hw_params_t *hwParams, double sampleRate )
{
    PaError result = paNoError;
    unsigned int reqRate, setRate, deviation;

    assert( pcm && hwParams );

    /* The Alsa sample rate is set by integer value; also the actual rate may differ */
    reqRate = setRate = (unsigned int) sampleRate;

    ENSURE_( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &setRate, NULL ), paUnanticipatedHostError );
    /* The value actually set will be put in 'setRate' (may be way off); check the deviation as a proportion
     * of the requested-rate with reference to the max-deviate-ratio (larger values allow less deviation) */
    deviation = abs( setRate - reqRate );
    if( deviation > 0 && deviation * RATE_MAX_DEVIATE_RATIO > reqRate )
        result = paInvalidSampleRate;

end:
    return result;

error:
    /* Log */
    {
        unsigned int _min = 0, _max = 0;
        int _dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_rate_min( hwParams, &_min, &_dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_rate_max( hwParams, &_max, &_dir ), paUnanticipatedHostError );
        PA_DEBUG(( "%s: SR min = %u, max = %u, req = %u\n", __FUNCTION__, _min, _max, reqRate ));
    }
    goto end;
}